

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

Gia_Man_t * Gia_ManDupWithBoxes(Gia_Man_t *p,int fSeq)

{
  int iVar1;
  Tim_Man_t *p_00;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  Gia_Man_t *p_01;
  size_t sVar11;
  char *pcVar12;
  Gia_Obj_t *pGVar13;
  Vec_Int_t *pVVar14;
  int *piVar15;
  Vec_Int_t *pVVar16;
  void *pvVar17;
  Gia_Man_t *pGVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar5 = Gia_ManBoxNum(p);
  if (iVar5 < 1) {
    __assert_fail("Gia_ManBoxNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x84,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  Gia_ManMarkSeqGiaWithBoxes(p,fSeq);
  p_01 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar2);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar2);
  }
  p_01->pName = pcVar12;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar2);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar2);
  }
  p_01->pSpec = pcVar12;
  p->pObjs->Value = 0;
  if (1 < p->nObjs) {
    lVar21 = 1;
    lVar20 = 5;
    do {
      if (p->nTravIdsAlloc <= lVar21) goto LAB_00728f7a;
      if (p->pTravIds[lVar21] == p->nTravIds) {
        pGVar3 = p->pObjs;
        uVar19 = *(ulong *)((long)pGVar3 + lVar20 * 4 + -8);
        uVar9 = (uint)uVar19;
        if ((uVar9 & 0x9fffffff) == 0x9fffffff) {
          pGVar13 = Gia_ManAppendObj(p_01);
          uVar19 = *(ulong *)pGVar13;
          *(ulong *)pGVar13 = uVar19 | 0x9fffffff;
          *(ulong *)pGVar13 =
               uVar19 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_01->pObjs;
          if ((pGVar13 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar13)) {
LAB_00728fb8:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_01->pObjs;
          if ((pGVar13 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar13)) goto LAB_00728fb8;
          iVar5 = (int)((ulong)((long)pGVar13 - (long)pGVar4) >> 2) * 0x55555556;
        }
        else {
          iVar5 = (int)(uVar19 & 0x1fffffff);
          if ((uVar19 & 0x1fffffff) == 0x1fffffff || (int)uVar9 < 0) {
            if ((-1 < (int)uVar9) || (iVar5 == 0x1fffffff)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                            ,0x96,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
            }
            uVar10 = *(uint *)((long)pGVar3 + lVar20 * 4 + (ulong)(uint)(iVar5 << 2) * -3);
            if ((int)uVar10 < 0) goto LAB_00728fd7;
            iVar5 = Gia_ManAppendCo(p_01,uVar10 ^ uVar9 >> 0x1d & 1);
          }
          else {
            uVar9 = *(uint *)((long)pGVar3 + lVar20 * 4 + (ulong)(uint)(iVar5 << 2) * -3);
            if (((int)uVar9 < 0) ||
               (uVar10 = *(uint *)((long)pGVar3 +
                                  lVar20 * 4 + (ulong)((uint)(uVar19 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar10 < 0)) {
LAB_00728fd7:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10f,"int Abc_LitNotCond(int, int)");
            }
            iVar5 = Gia_ManAppendAnd(p_01,uVar9 ^ (uint)(uVar19 >> 0x1d) & 1,
                                     uVar10 ^ (uint)(uVar19 >> 0x3d) & 1);
          }
        }
        *(int *)(&pGVar3->field_0x0 + lVar20 * 4) = iVar5;
      }
      lVar21 = lVar21 + 1;
      lVar20 = lVar20 + 3;
    } while (lVar21 < p->nObjs);
  }
  iVar5 = Gia_ManHasDangling(p_01);
  if (iVar5 != 0) {
    __assert_fail("!Gia_ManHasDangling(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x98,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  if (fSeq == 0) {
    pVVar14 = p->vRegClasses;
    if (pVVar14 != (Vec_Int_t *)0x0) {
      pVVar16 = (Vec_Int_t *)malloc(0x10);
      iVar5 = pVVar14->nSize;
      lVar20 = (long)iVar5;
      pVVar16->nSize = iVar5;
      pVVar16->nCap = iVar5;
      if (lVar20 == 0) {
        piVar15 = (int *)0x0;
      }
      else {
        piVar15 = (int *)malloc(lVar20 * 4);
      }
      pVVar16->pArray = piVar15;
      memcpy(piVar15,pVVar14->pArray,lVar20 << 2);
      p_01->vRegClasses = pVVar16;
    }
    pVVar14 = p->vRegInits;
    if (pVVar14 != (Vec_Int_t *)0x0) {
      pVVar16 = (Vec_Int_t *)malloc(0x10);
      iVar5 = pVVar14->nSize;
      lVar20 = (long)iVar5;
      pVVar16->nSize = iVar5;
      pVVar16->nCap = iVar5;
      if (lVar20 == 0) {
        piVar15 = (int *)0x0;
      }
      else {
        piVar15 = (int *)malloc(lVar20 * 4);
      }
      pVVar16->pArray = piVar15;
      memcpy(piVar15,pVVar14->pArray,lVar20 << 2);
      p_01->vRegInits = pVVar16;
    }
  }
  else {
    iVar6 = Gia_ManRegBoxNum(p);
    pVVar14 = (Vec_Int_t *)malloc(0x10);
    iVar5 = 0x10;
    if (0xe < iVar6 - 1U) {
      iVar5 = iVar6;
    }
    pVVar14->nSize = 0;
    pVVar14->nCap = iVar5;
    if (iVar5 == 0) {
      piVar15 = (int *)0x0;
    }
    else {
      piVar15 = (int *)malloc((long)iVar5 << 2);
    }
    pVVar14->pArray = piVar15;
    p_01->vRegClasses = pVVar14;
    if (p->vRegInits != (Vec_Int_t *)0x0) {
      iVar6 = Gia_ManRegBoxNum(p);
      pVVar14 = (Vec_Int_t *)malloc(0x10);
      iVar5 = 0x10;
      if (0xe < iVar6 - 1U) {
        iVar5 = iVar6;
      }
      pVVar14->nSize = 0;
      pVVar14->nCap = iVar5;
      if (iVar5 == 0) {
        piVar15 = (int *)0x0;
      }
      else {
        piVar15 = (int *)malloc((long)iVar5 << 2);
      }
      pVVar14->pArray = piVar15;
      p_01->vRegInits = pVVar14;
    }
    iVar5 = p->vCos->nSize;
    iVar6 = p->nRegs;
    iVar7 = Gia_ManRegBoxNum(p);
    iVar8 = Gia_ManRegBoxNum(p);
    if (0 < iVar8) {
      lVar20 = (long)(iVar5 - (iVar6 + iVar7));
      lVar21 = 0;
      do {
        if ((lVar20 < 0) || (p->vCos->nSize <= lVar20)) {
LAB_00728f3c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = p->vCos->pArray[lVar20];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_00728f5b:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->nTravIdsAlloc <= iVar5) {
LAB_00728f7a:
          __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (p->pTravIds[iVar5] == p->nTravIds) {
          if (p->vRegClasses->nSize <= lVar21) goto LAB_00728f3c;
          Vec_IntPush(p_01->vRegClasses,p->vRegClasses->pArray[lVar21]);
          pVVar14 = p->vRegInits;
          if (pVVar14 != (Vec_Int_t *)0x0) {
            if (pVVar14->nSize <= lVar21) goto LAB_00728f3c;
            Vec_IntPush(p_01->vRegInits,pVVar14->pArray[lVar21]);
          }
        }
        lVar21 = lVar21 + 1;
        iVar5 = Gia_ManRegBoxNum(p);
        lVar20 = lVar20 + 1;
      } while (lVar21 < iVar5);
    }
  }
  iVar6 = Gia_ManBoxNum(p);
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar5 = iVar6;
  }
  pVVar14->nSize = 0;
  pVVar14->nCap = iVar5;
  iVar6 = 0;
  if (iVar5 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar14->pArray = piVar15;
  iVar5 = Tim_ManPiNum(p_00);
  iVar7 = Gia_ManBoxNum(p);
  if (0 < iVar7) {
    iVar7 = 0;
    iVar6 = 0;
    do {
      uVar9 = Tim_ManBoxInputNum(p_00,iVar7);
      uVar10 = Tim_ManBoxOutputNum(p_00,iVar7);
      iVar8 = 0;
      if (0 < (int)uVar9) {
        lVar20 = (long)iVar6;
        uVar19 = (ulong)uVar9;
        iVar8 = 0;
        do {
          if ((iVar6 < 0) || (p->vCos->nSize <= lVar20)) goto LAB_00728f3c;
          iVar1 = p->vCos->pArray[lVar20];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00728f5b;
          if (p->nTravIdsAlloc <= iVar1) goto LAB_00728f7a;
          iVar8 = iVar8 + (uint)(p->pTravIds[iVar1] == p->nTravIds);
          lVar20 = lVar20 + 1;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
      if (0 < (int)uVar10) {
        lVar20 = (long)iVar5;
        uVar19 = (ulong)uVar10;
        do {
          if ((iVar5 < 0) || (p->vCis->nSize <= lVar20)) goto LAB_00728f3c;
          iVar1 = p->vCis->pArray[lVar20];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00728f5b;
          if (p->nTravIdsAlloc <= iVar1) goto LAB_00728f7a;
          iVar8 = iVar8 + (uint)(p->pTravIds[iVar1] == p->nTravIds);
          lVar20 = lVar20 + 1;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
      if (iVar8 != uVar10 + uVar9 && iVar8 != 0) {
        __assert_fail("nMarked == 0 || nMarked == nBoxIns + nBoxOuts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                      ,0xbf,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
      }
      if (iVar8 != 0) {
        Vec_IntPush(pVVar14,iVar7);
      }
      iVar6 = uVar9 + iVar6;
      iVar5 = uVar10 + iVar5;
      iVar7 = iVar7 + 1;
      iVar8 = Gia_ManBoxNum(p);
    } while (iVar7 < iVar8);
  }
  iVar7 = Tim_ManPoNum(p_00);
  if (iVar5 != p->vCis->nSize) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0xc4,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  if (iVar7 + iVar6 != p->vCos->nSize) {
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0xc5,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  iVar5 = Gia_ManRegBoxNum(p);
  iVar6 = Gia_ManRegBoxNum(p_01);
  pvVar17 = Gia_ManUpdateTimMan2(p,pVVar14,iVar5 - iVar6);
  p_01->pManTime = pvVar17;
  if (p->pAigExtra == (Gia_Man_t *)0x0) {
    __assert_fail("p->pAigExtra != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0xc9,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  if (p_01->pAigExtra != (Gia_Man_t *)0x0) {
    __assert_fail("pNew->pAigExtra == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0xca,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  pGVar18 = Gia_ManUpdateExtraAig2(p->pManTime,p->pAigExtra,pVVar14);
  p_01->pAigExtra = pGVar18;
  iVar5 = p_01->vCis->nSize;
  iVar6 = Tim_ManPiNum((Tim_Man_t *)p_01->pManTime);
  if (iVar5 != iVar6 + p_01->pAigExtra->vCos->nSize) {
    __assert_fail("Gia_ManCiNum(pNew) == Tim_ManPiNum((Tim_Man_t*)pNew->pManTime) + Gia_ManCoNum(pNew->pAigExtra)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0xcc,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  if (pVVar14->pArray != (int *)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (int *)0x0;
  }
  free(pVVar14);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDupWithBoxes( Gia_Man_t * p, int fSeq )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vBoxesLeft;
    int curCi, curCo, nBoxIns, nBoxOuts;
    int i, k, iShift, nMarked;
    assert( Gia_ManBoxNum(p) > 0 );
    // mark useful boxes
    Gia_ManMarkSeqGiaWithBoxes( p, fSeq );
    // duplicate marked entries
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( !Gia_ObjIsTravIdCurrent(p, pObj) )
            continue;
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else assert( 0 );
    }
    assert( !Gia_ManHasDangling(pNew) );
    // collect remaining flops
    if ( fSeq )
    {
        pNew->vRegClasses = Vec_IntAlloc( Gia_ManRegBoxNum(p) );
        if ( p->vRegInits )
            pNew->vRegInits = Vec_IntAlloc( Gia_ManRegBoxNum(p) );
        iShift = Gia_ManPoNum(p) - Gia_ManRegBoxNum(p);
        for ( i = 0; i < Gia_ManRegBoxNum(p); i++ )
            if ( Gia_ObjIsTravIdCurrent(p, Gia_ManCo(p, iShift + i)) )
            {
                Vec_IntPush( pNew->vRegClasses, Vec_IntEntry(p->vRegClasses, i) );
                if ( p->vRegInits )
                    Vec_IntPush( pNew->vRegInits, Vec_IntEntry(p->vRegInits, i) );
            }
    }
    else 
    {
        if ( p->vRegClasses )
            pNew->vRegClasses = Vec_IntDup( p->vRegClasses );
        if ( p->vRegInits )
            pNew->vRegInits = Vec_IntDup( p->vRegInits );
    }
    // collect remaining boxes
    vBoxesLeft = Vec_IntAlloc( Gia_ManBoxNum(p) );
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Gia_ManBoxNum(p); i++ )
    {
        nBoxIns = Tim_ManBoxInputNum(pManTime, i);
        nBoxOuts = Tim_ManBoxOutputNum(pManTime, i);
        nMarked = 0;
        for ( k = 0; k < nBoxIns; k++ )
            nMarked += Gia_ObjIsTravIdCurrent( p, Gia_ManCo(p, curCo + k) );
        for ( k = 0; k < nBoxOuts; k++ )
            nMarked += Gia_ObjIsTravIdCurrent( p, Gia_ManCi(p, curCi + k) );
        curCo += nBoxIns;
        curCi += nBoxOuts;
        // check presence
        assert( nMarked == 0 || nMarked == nBoxIns + nBoxOuts );
        if ( nMarked )
            Vec_IntPush( vBoxesLeft, i );
    }
    curCo += Tim_ManPoNum(pManTime);
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
    // update timing manager
    pNew->pManTime = Gia_ManUpdateTimMan2( p, vBoxesLeft, Gia_ManRegBoxNum(p) - Gia_ManRegBoxNum(pNew) );
    // update extra STG
    assert( p->pAigExtra != NULL );
    assert( pNew->pAigExtra == NULL );
    pNew->pAigExtra = Gia_ManUpdateExtraAig2( p->pManTime, p->pAigExtra, vBoxesLeft );
    assert( Gia_ManCiNum(pNew) == Tim_ManPiNum((Tim_Man_t*)pNew->pManTime) + Gia_ManCoNum(pNew->pAigExtra) );
    Vec_IntFree( vBoxesLeft );
    return pNew;
}